

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

bool __thiscall Json::IsValid(Json *this)

{
  bool bVar1;
  undefined8 uVar2;
  size_t sVar3;
  Json *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  int in_stack_00000044;
  Json *in_stack_00000048;
  Document *pDVar4;
  string *psVar5;
  string local_60 [36];
  int in_stack_ffffffffffffffc4;
  Json *in_stack_ffffffffffffffc8;
  string local_30 [47];
  bool local_1;
  
  bVar1 = rapidjson::
          GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::IsValid(&in_RDI->p);
  if (bVar1) {
    bVar1 = rapidjson::
            GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::HasParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                             *)0x10cbd3);
    if (bVar1) {
      pDVar4 = &in_RDI->d;
      sVar3 = rapidjson::
              GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::GetErrorOffset((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                *)0x10cbee);
      rapidjson::
      GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
      ::GetParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       *)0x10cbfc);
      psVar5 = local_60;
      GetParseJsonErrorStr_abi_cxx11_(in_stack_00000048,in_stack_00000044);
      uVar2 = std::__cxx11::string::c_str();
      SetErrorMsg(in_RDI,"wrong json: offset:%ld. %s",sVar3,uVar2,in_R8,in_R9,pDVar4,psVar5);
      std::__cxx11::string::~string(local_60);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    rapidjson::
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::GetParseErrorCode(&in_RDI->p);
    GetParseUriErrorStr_abi_cxx11_(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    uVar2 = std::__cxx11::string::c_str();
    SetErrorMsg(in_RDI,"wrong uri:%s",uVar2);
    std::__cxx11::string::~string(local_30);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool IsValid()
    {
        if (!p.IsValid()) {
            SetErrorMsg("wrong uri:%s", GetParseUriErrorStr(p.GetParseErrorCode()).c_str());
            return false;
        }
        if (d.HasParseError()) {
            SetErrorMsg("wrong json: offset:%ld. %s", d.GetErrorOffset(), GetParseJsonErrorStr(d.GetParseError()).c_str());
            return false;
        }
        return true;
    }